

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O0

void __thiscall DrawerCommandQueue::StopThreads(DrawerCommandQueue *this)

{
  bool bVar1;
  DrawerThread *thread;
  iterator __end1;
  iterator __begin1;
  vector<DrawerThread,_std::allocator<DrawerThread>_> *__range1;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  DrawerCommandQueue *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->start_mutex);
  this->shutdown_flag = true;
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
  std::condition_variable::notify_all();
  __end1 = std::vector<DrawerThread,_std::allocator<DrawerThread>_>::begin(&this->threads);
  thread = (DrawerThread *)
           std::vector<DrawerThread,_std::allocator<DrawerThread>_>::end(&this->threads);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<DrawerThread_*,_std::vector<DrawerThread,_std::allocator<DrawerThread>_>_>
                                *)&thread);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<DrawerThread_*,_std::vector<DrawerThread,_std::allocator<DrawerThread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<DrawerThread_*,_std::vector<DrawerThread,_std::allocator<DrawerThread>_>_>::
    operator++(&__end1);
  }
  std::vector<DrawerThread,_std::allocator<DrawerThread>_>::clear(&this->threads);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_20);
  this->shutdown_flag = false;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void DrawerCommandQueue::StopThreads()
{
	std::unique_lock<std::mutex> lock(start_mutex);
	shutdown_flag = true;
	lock.unlock();
	start_condition.notify_all();
	for (auto &thread : threads)
		thread.thread.join();
	threads.clear();
	lock.lock();
	shutdown_flag = false;
}